

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleValueHashTableOf.hpp
# Opt level: O2

void __thiscall
SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeBucketElem
          (SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this,void *key,
          XMLSize_t *hashVal)

{
  ValueHashTableBucketElem<unsigned_int> *pVVar1;
  ValueHashTableBucketElem<unsigned_int> *pVVar2;
  NoSuchElementException *this_00;
  ValueHashTableBucketElem<unsigned_int> **ppVVar3;
  ulong uVar4;
  pointer_____offset_0x10___ *ppuVar5;
  
  uVar4 = (ulong)key % this->fHashModulus;
  *hashVal = uVar4;
  if (this->fHashModulus < uVar4) {
    this_00 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    xercesc_4_0::RuntimeException::RuntimeException
              ((RuntimeException *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/MemHandlerTest/SimpleValueHashTableOf.hpp"
               ,0x18b,HshTbl_BadHashFromKey,(MemoryManager *)0x0);
    ppuVar5 = &xercesc_4_0::RuntimeException::typeinfo;
  }
  else {
    pVVar2 = (ValueHashTableBucketElem<unsigned_int> *)0x0;
    ppVVar3 = this->fBucketList + uVar4;
    while (pVVar1 = *ppVVar3, pVVar1 != (ValueHashTableBucketElem<unsigned_int> *)0x0) {
      if (pVVar1->fKey == key) {
        ppVVar3 = &pVVar2->fNext;
        if (pVVar2 == (ValueHashTableBucketElem<unsigned_int> *)0x0) {
          ppVVar3 = this->fBucketList + uVar4;
        }
        *ppVVar3 = pVVar1->fNext;
        operator_delete(pVVar1,0x18);
        return;
      }
      pVVar2 = pVVar1;
      ppVVar3 = &pVVar1->fNext;
    }
    this_00 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    xercesc_4_0::NoSuchElementException::NoSuchElementException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/MemHandlerTest/SimpleValueHashTableOf.hpp"
               ,0x1af,HshTbl_NoSuchKeyExists,(MemoryManager *)0x0);
    ppuVar5 = &xercesc_4_0::NoSuchElementException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar5,xercesc_4_0::XMLException::~XMLException);
}

Assistant:

void SimpleValueHashTableOf<TVal, THasher>::
removeBucketElem(const void* const key, XMLSize_t& hashVal)
{
    // Hash the key
    hashVal = fHasher.getHashVal(key, fHashModulus);
    if (hashVal > fHashModulus)
        ThrowXML(RuntimeException, XMLExcepts::HshTbl_BadHashFromKey);

    //
    //  Search the given bucket for this key. Keep up with the previous
    //  element so we can patch around it.
    //
    ValueHashTableBucketElem<TVal>* curElem = fBucketList[hashVal];
    ValueHashTableBucketElem<TVal>* lastElem = 0;

    while (curElem)
    {
        if (fHasher.equals(key, curElem->fKey))
        {
            if (!lastElem)
            {
                // It was the first in the bucket
                fBucketList[hashVal] = curElem->fNext;
            }
             else
            {
                // Patch around the current element
                lastElem->fNext = curElem->fNext;
            }

            // Delete the current element
            delete curElem;

            return;
        }

        // Move both pointers upwards
        lastElem = curElem;
        curElem = curElem->fNext;
    }

    // We never found that key
    ThrowXML(NoSuchElementException, XMLExcepts::HshTbl_NoSuchKeyExists);
}